

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

void hdr_reset_internal_counters(hdr_histogram *h)

{
  int64_t iVar1;
  int64_t max_value;
  int64_t count_at_index;
  long lStack_20;
  int i;
  int64_t observed_total_count;
  int max_index;
  int min_non_zero_index;
  hdr_histogram *h_local;
  
  observed_total_count._4_4_ = -1;
  observed_total_count._0_4_ = -1;
  lStack_20 = 0;
  for (count_at_index._4_4_ = 0; count_at_index._4_4_ < h->counts_len;
      count_at_index._4_4_ = count_at_index._4_4_ + 1) {
    iVar1 = counts_get_direct(h,count_at_index._4_4_);
    if (0 < iVar1) {
      lStack_20 = iVar1 + lStack_20;
      observed_total_count._0_4_ = count_at_index._4_4_;
      if ((observed_total_count._4_4_ == -1) && (count_at_index._4_4_ != 0)) {
        observed_total_count._4_4_ = count_at_index._4_4_;
      }
    }
  }
  if ((int)observed_total_count == -1) {
    h->max_value = 0;
  }
  else {
    iVar1 = hdr_value_at_index(h,(int)observed_total_count);
    iVar1 = highest_equivalent_value(h,iVar1);
    h->max_value = iVar1;
  }
  if (observed_total_count._4_4_ == -1) {
    h->min_value = 0x7fffffffffffffff;
  }
  else {
    iVar1 = hdr_value_at_index(h,observed_total_count._4_4_);
    h->min_value = iVar1;
  }
  h->total_count = lStack_20;
  return;
}

Assistant:

void hdr_reset_internal_counters(struct hdr_histogram* h)
{
    int min_non_zero_index = -1;
    int max_index = -1;
    int64_t observed_total_count = 0;
    int i;

    for (i = 0; i < h->counts_len; i++)
    {
        int64_t count_at_index;

        if ((count_at_index = counts_get_direct(h, i)) > 0)
        {
            observed_total_count += count_at_index;
            max_index = i;
            if (min_non_zero_index == -1 && i != 0)
            {
                min_non_zero_index = i;
            }
        }
    }

    if (max_index == -1)
    {
        h->max_value = 0;
    }
    else
    {
        int64_t max_value = hdr_value_at_index(h, max_index);
        h->max_value = highest_equivalent_value(h, max_value);
    }

    if (min_non_zero_index == -1)
    {
        h->min_value = INT64_MAX;
    }
    else
    {
        h->min_value = hdr_value_at_index(h, min_non_zero_index);
    }

    h->total_count = observed_total_count;
}